

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initDStream_usingDict(ZSTD_DStream *zds,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t err_code_1;
  size_t err_code;
  ZSTD_DCtx *in_stack_ffffffffffffffc8;
  ZSTD_DCtx *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = ZSTD_DCtx_reset(in_stack_ffffffffffffffc8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_DCtx_loadDictionary(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x2f6c9a)
    ;
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = ZSTD_startingInputLength((ZSTD_format_e)(local_8 >> 0x20));
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initDStream_usingDict(ZSTD_DStream* zds, const void* dict, size_t dictSize)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(zds, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_loadDictionary(zds, dict, dictSize) , "");
    return ZSTD_startingInputLength(zds->format);
}